

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O3

void __thiscall
duckdb::RowVersionManager::AppendVersionInfo
          (RowVersionManager *this,TransactionData transaction,idx_t count,idx_t row_group_start,
          idx_t row_group_end)

{
  idx_t iVar1;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Alloc_hider _Var5;
  int iVar6;
  ChunkConstantInfo *this_00;
  pointer pCVar7;
  reference pvVar8;
  pointer pCVar9;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> this_01;
  transaction_t tVar10;
  InternalException *this_02;
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *this_03;
  ulong uVar11;
  ulong __n;
  size_type vector_idx;
  long lVar12;
  long lVar13;
  idx_t i;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  optional_ptr<duckdb::ChunkVectorInfo,_true> new_info;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> local_78;
  transaction_t local_70;
  ulong local_68;
  size_type local_60;
  ulong local_58;
  string local_50;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  this->has_changes = true;
  vector_idx = row_group_end - 1 >> 0xb;
  FillVectorInfo(this,vector_idx);
  local_58 = row_group_start >> 0xb;
  if (local_58 <= vector_idx) {
    uVar15 = row_group_end - (row_group_end - 1 & 0xfffffffffffff800);
    this_03 = &this->vector_info;
    local_70 = 0xfffffffffffffffe;
    __n = local_58;
    local_68 = uVar15;
    local_60 = vector_idx;
    do {
      uVar14 = 0;
      if (__n == local_58) {
        uVar14 = (ulong)((uint)row_group_start & 0x7ff);
      }
      uVar11 = 0x800;
      if (__n == vector_idx) {
        uVar11 = uVar15;
      }
      if (uVar11 == 0x800 && uVar14 == 0) {
        iVar1 = this->start;
        this_00 = (ChunkConstantInfo *)operator_new(0x28);
        ChunkConstantInfo::ChunkConstantInfo(this_00,iVar1 + __n * 0x800);
        vector_idx = local_60;
        local_50._M_dataplus._M_p = (pointer)this_00;
        pCVar7 = unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                 ::operator->((unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                               *)&local_50);
        uVar15 = local_68;
        pCVar7->insert_id = transaction.transaction_id;
        pCVar7 = unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                 ::operator->((unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                               *)&local_50);
        _Var5._M_p = local_50._M_dataplus._M_p;
        pCVar7->delete_id = local_70;
        local_50._M_dataplus._M_p = (pointer)0x0;
        pvVar8 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::operator[](this_03,__n);
        _Var2._M_head_impl =
             (pvVar8->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
             _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
             super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
        (pvVar8->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
        super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
        super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = (ChunkInfo *)_Var5._M_p;
        if (_Var2._M_head_impl != (ChunkInfo *)0x0) {
          (**(code **)((long)(_Var2._M_head_impl)->_vptr_ChunkInfo + 8))();
        }
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
      }
      else {
        local_78._M_head_impl = (ChunkInfo *)0x0;
        pvVar8 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::operator[](this_03,__n);
        if ((pvVar8->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
            _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
            super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl == (ChunkInfo *)0x0) {
          iVar1 = this->start;
          this_01._M_head_impl = (ChunkInfo *)operator_new(0x8030);
          ChunkVectorInfo::ChunkVectorInfo
                    ((ChunkVectorInfo *)this_01._M_head_impl,iVar1 + __n * 0x800);
          local_78._M_head_impl = this_01._M_head_impl;
          pvVar8 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                   ::operator[](this_03,__n);
          uVar15 = local_68;
          _Var2._M_head_impl =
               (pvVar8->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
               super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
          (pvVar8->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
          _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
          _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
          super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = this_01._M_head_impl;
          if (_Var2._M_head_impl != (ChunkInfo *)0x0) {
            (**(code **)((long)(_Var2._M_head_impl)->_vptr_ChunkInfo + 8))();
          }
        }
        else {
          pvVar8 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                   ::operator[](this_03,__n);
          pCVar9 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                   operator->(pvVar8);
          if (pCVar9->type != VECTOR_INFO) {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,
                       "Error in RowVersionManager::AppendVersionInfo - expected either a ChunkVectorInfo or no version info"
                       ,"");
            InternalException::InternalException(this_02,&local_50);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar8 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                   ::operator[](this_03,__n);
          pCVar9 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                   operator->(pvVar8);
          local_78._M_head_impl = &ChunkInfo::Cast<duckdb::ChunkVectorInfo>(pCVar9)->super_ChunkInfo
          ;
        }
        optional_ptr<duckdb::ChunkVectorInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::ChunkVectorInfo,_true> *)&local_78);
        auVar4 = _DAT_012b0ff0;
        auVar3 = _DAT_012b0fe0;
        tVar10 = transaction.transaction_id;
        if (uVar14 == 0) {
LAB_0060ffc3:
          *(transaction_t *)&local_78._M_head_impl[0x2ab].type = tVar10;
        }
        else if (*(transaction_t *)&local_78._M_head_impl[0x2ab].type != transaction.transaction_id)
        {
          *(bool *)&local_78._M_head_impl[0x2ac]._vptr_ChunkInfo = false;
          tVar10 = local_70;
          goto LAB_0060ffc3;
        }
        lVar12 = uVar11 - uVar14;
        vector_idx = local_60;
        if (uVar14 <= uVar11 && lVar12 != 0) {
          lVar13 = lVar12 + -1;
          auVar17._8_4_ = (int)lVar13;
          auVar17._0_8_ = lVar13;
          auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar17 = auVar17 ^ auVar4;
          uVar11 = 0;
          do {
            auVar18._8_4_ = (int)uVar11;
            auVar18._0_8_ = uVar11;
            auVar18._12_4_ = (int)(uVar11 >> 0x20);
            auVar18 = (auVar18 | auVar3) ^ auVar4;
            if ((bool)(~(auVar17._4_4_ < auVar18._4_4_ ||
                        auVar17._0_4_ < auVar18._0_4_ && auVar18._4_4_ == auVar17._4_4_) & 1)) {
              (&local_78._M_head_impl[1]._vptr_ChunkInfo)[uVar14 + uVar11] =
                   (_func_int **)transaction.transaction_id;
            }
            if (auVar18._12_4_ <= auVar17._12_4_ &&
                (auVar18._8_4_ <= auVar17._8_4_ || auVar18._12_4_ != auVar17._12_4_)) {
              (&local_78._M_head_impl[1].start)[uVar14 + uVar11] = transaction.transaction_id;
            }
            uVar11 = uVar11 + 2;
          } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar11);
        }
      }
      bVar16 = __n != vector_idx;
      __n = __n + 1;
    } while (bVar16);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void RowVersionManager::AppendVersionInfo(TransactionData transaction, idx_t count, idx_t row_group_start,
                                          idx_t row_group_end) {
	lock_guard<mutex> lock(version_lock);
	has_changes = true;
	idx_t start_vector_idx = row_group_start / STANDARD_VECTOR_SIZE;
	idx_t end_vector_idx = (row_group_end - 1) / STANDARD_VECTOR_SIZE;

	// fill-up vector_info
	FillVectorInfo(end_vector_idx);

	// insert the version info nodes
	for (idx_t vector_idx = start_vector_idx; vector_idx <= end_vector_idx; vector_idx++) {
		idx_t vector_start =
		    vector_idx == start_vector_idx ? row_group_start - start_vector_idx * STANDARD_VECTOR_SIZE : 0;
		idx_t vector_end =
		    vector_idx == end_vector_idx ? row_group_end - end_vector_idx * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		if (vector_start == 0 && vector_end == STANDARD_VECTOR_SIZE) {
			// entire vector is encapsulated by append: append a single constant
			auto constant_info = make_uniq<ChunkConstantInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
			constant_info->insert_id = transaction.transaction_id;
			constant_info->delete_id = NOT_DELETED_ID;
			vector_info[vector_idx] = std::move(constant_info);
		} else {
			// part of a vector is encapsulated: append to that part
			optional_ptr<ChunkVectorInfo> new_info;
			if (!vector_info[vector_idx]) {
				// first time appending to this vector: create new info
				auto insert_info = make_uniq<ChunkVectorInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
				new_info = insert_info.get();
				vector_info[vector_idx] = std::move(insert_info);
			} else if (vector_info[vector_idx]->type == ChunkInfoType::VECTOR_INFO) {
				// use existing vector
				new_info = &vector_info[vector_idx]->Cast<ChunkVectorInfo>();
			} else {
				throw InternalException("Error in RowVersionManager::AppendVersionInfo - expected either a "
				                        "ChunkVectorInfo or no version info");
			}
			new_info->Append(vector_start, vector_end, transaction.transaction_id);
		}
	}
}